

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::ByteMapBuilder::Build(ByteMapBuilder *this,uint8_t *bytemap,int *bytemap_range)

{
  int iVar1;
  int __c;
  int c;
  
  this->nextcolor_ = 0;
  c = 0;
  do {
    iVar1 = Bitmap256::FindNextSetBit(&this->splits_,c);
    __c = Recolor(this,this->colors_[iVar1]);
    if (c <= iVar1) {
      memset(bytemap + c,__c,(ulong)(uint)(iVar1 - c) + 1);
      c = iVar1 + 1;
    }
  } while (c < 0x100);
  *bytemap_range = this->nextcolor_;
  return;
}

Assistant:

void ByteMapBuilder::Build(uint8_t* bytemap, int* bytemap_range) {
  // Assign byte classes numbered from 0.
  nextcolor_ = 0;

  int c = 0;
  while (c < 256) {
    int next = splits_.FindNextSetBit(c);
    uint8_t b = static_cast<uint8_t>(Recolor(colors_[next]));
    while (c <= next) {
      bytemap[c] = b;
      c++;
    }
  }

  *bytemap_range = nextcolor_;
}